

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

void __thiscall CompileCommandParser::ParseString(CompileCommandParser *this)

{
  bool bVar1;
  CompileCommandParser *this_local;
  
  std::__cxx11::string::operator=((string *)&this->String,"");
  bVar1 = Expect(this,'\"');
  if (bVar1) {
    while (bVar1 = Expect(this,'\"'), ((bVar1 ^ 0xffU) & 1) != 0) {
      Expect(this,'\\');
      std::__cxx11::string::append((ulong)&this->String,'\x01');
      Next(this);
    }
  }
  return;
}

Assistant:

void ParseString()
  {
    this->String = "";
    if(!Expect('"')) return;
    while (!Expect('"'))
      {
      Expect('\\');
      this->String.append(1,C);
      Next();
      }
  }